

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLJointsLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::JointsLoader::begin__joint(JointsLoader *this,joint__AttributeData *attributeData)

{
  Joint *pJVar1;
  ParserChar *colladaId;
  allocator<char> local_39;
  UniqueId local_38;
  
  pJVar1 = (Joint *)operator_new(0x88);
  IFilePartLoader::createUniqueIdFromId
            (&local_38,
             &((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             attributeData->id,JOINT);
  COLLADAFW::Joint::Joint(pJVar1,&local_38);
  this->mCurrentJoint = pJVar1;
  COLLADAFW::UniqueId::~UniqueId(&local_38);
  if (attributeData->name == (char *)0x0) {
    if (attributeData->id != (char *)0x0) {
      pJVar1 = this->mCurrentJoint;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,attributeData->id,&local_39);
      std::__cxx11::string::_M_assign((string *)&pJVar1->mName);
      goto LAB_00837784;
    }
  }
  else {
    pJVar1 = this->mCurrentJoint;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,attributeData->name,&local_39);
    std::__cxx11::string::_M_assign((string *)&pJVar1->mName);
LAB_00837784:
    std::__cxx11::string::~string((string *)&local_38);
    if (attributeData->id != (char *)0x0) {
      pJVar1 = this->mCurrentJoint;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,attributeData->id,&local_39);
      std::__cxx11::string::_M_assign((string *)&pJVar1->mOriginalId);
      std::__cxx11::string::~string((string *)&local_38);
      colladaId = attributeData->id;
      goto LAB_008377cb;
    }
  }
  colladaId = (char *)0x0;
LAB_008377cb:
  IFilePartLoader::addToSidTree
            (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             colladaId,attributeData->sid,(Object *)this->mCurrentJoint);
  return true;
}

Assistant:

bool JointsLoader::begin__joint( const joint__AttributeData& attributeData )
	{
		mCurrentJoint = FW_NEW COLLADAFW::Joint( getHandlingFilePartLoader()->createUniqueIdFromId( attributeData.id, COLLADAFW::Joint::ID()) );
		if ( attributeData.name )
		{
			mCurrentJoint->setName(attributeData.name);
		}
		else if ( attributeData.id )
		{
			mCurrentJoint->setName(attributeData.id);
		}

		if ( attributeData.id )
		{
			mCurrentJoint->setOriginalId(attributeData.id);
		}
		getHandlingFilePartLoader()->addToSidTree( attributeData.id, attributeData.sid, mCurrentJoint);
		return true;
	}